

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_remove_seg_add_tets(REF_CAVITY ref_cavity,REF_INT *seg_nodes)

{
  REF_GRID pRVar1;
  REF_NODE ref_node_00;
  uint uVar2;
  REF_INT local_a8;
  REF_INT local_a4;
  int local_a0;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  int local_70;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT tri_cell;
  REF_INT face_nodes [3];
  REF_INT face_node;
  REF_INT cell_face;
  REF_BOOL all_local;
  REF_BOOL already_have_it;
  REF_INT cell;
  REF_INT cell_node;
  REF_INT item;
  REF_INT tri_list [2];
  REF_INT ntri;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_INT *seg_nodes_local;
  REF_CAVITY ref_cavity_local;
  
  pRVar1 = ref_cavity->ref_grid;
  ref_node_00 = pRVar1->node;
  unique0x00012000 = pRVar1->cell[8];
  if ((ref_cavity->seg_rm_adds_tet == 0) && (ref_cavity->tet_list->n == 0)) {
    ref_cavity_local._4_4_ = 0;
  }
  else if (ref_cavity->state == REF_CAVITY_UNKNOWN) {
    ref_cavity_local._4_4_ =
         ref_cell_list_with2(pRVar1->cell[3],*seg_nodes,seg_nodes[1],2,tri_list,&cell_node);
    if (ref_cavity_local._4_4_ == 0) {
      if ((long)tri_list[0] == 2) {
        if ((*seg_nodes < 0) || (stack0xffffffffffffffc8->ref_adj->nnode <= *seg_nodes)) {
          local_a0 = -1;
        }
        else {
          local_a0 = stack0xffffffffffffffc8->ref_adj->first[*seg_nodes];
        }
        cell = local_a0;
        if (local_a0 == -1) {
          local_a4 = -1;
        }
        else {
          local_a4 = stack0xffffffffffffffc8->ref_adj->item[local_a0].ref;
        }
        all_local = local_a4;
        while (cell != -1) {
          for (already_have_it = 0; already_have_it < stack0xffffffffffffffc8->node_per;
              already_have_it = already_have_it + 1) {
            if (seg_nodes[1] ==
                stack0xffffffffffffffc8->c2n
                [already_have_it + stack0xffffffffffffffc8->size_per * all_local]) {
              uVar2 = ref_list_contains(ref_cavity->tet_list,all_local,&cell_face);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0xca,"ref_cavity_remove_seg_add_tets",(ulong)uVar2,"have tet?");
                return uVar2;
              }
              if (cell_face == 0) {
                uVar2 = ref_list_push(ref_cavity->tet_list,all_local);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0xcc,"ref_cavity_remove_seg_add_tets",(ulong)uVar2,"save tet");
                  return uVar2;
                }
                uVar2 = ref_cell_all_local(stack0xffffffffffffffc8,ref_node_00,all_local,&face_node)
                ;
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0xcd,"ref_cavity_remove_seg_add_tets",(ulong)uVar2,"local cell");
                  return uVar2;
                }
                if (face_node == 0) {
                  ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
                  return 0;
                }
                for (face_nodes[2] = 0; face_nodes[2] < stack0xffffffffffffffc8->face_per;
                    face_nodes[2] = face_nodes[2] + 1) {
                  for (face_nodes[1] = 0; face_nodes[1] < 3; face_nodes[1] = face_nodes[1] + 1) {
                    (&ref_private_macro_code_rss)[face_nodes[1]] =
                         stack0xffffffffffffffc8->c2n
                         [stack0xffffffffffffffc8->f2n[face_nodes[1] + face_nodes[2] * 4] +
                          stack0xffffffffffffffc8->size_per * all_local];
                  }
                  uVar2 = ref_cell_with(pRVar1->cell[3],&ref_private_macro_code_rss,&local_70);
                  if ((uVar2 != 0) && (uVar2 != 5)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0xd8,"ref_cavity_remove_seg_add_tets",(ulong)uVar2,
                           "search for boundary tri");
                    return uVar2;
                  }
                  if (((local_70 == -1) || ((local_70 != cell_node && (local_70 != item)))) &&
                     (uVar2 = ref_cavity_insert_face(ref_cavity,&ref_private_macro_code_rss),
                     uVar2 != 0)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0xdd,"ref_cavity_remove_seg_add_tets",(ulong)uVar2,"tet face rm seg");
                    return uVar2;
                  }
                }
              }
            }
          }
          cell = stack0xffffffffffffffc8->ref_adj->item[cell].next;
          if (cell == -1) {
            local_a8 = -1;
          }
          else {
            local_a8 = stack0xffffffffffffffc8->ref_adj->item[cell].ref;
          }
          all_local = local_a8;
        }
        ref_cavity_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0xc4,"ref_cavity_remove_seg_add_tets","cavity segment does not have two tri",2,
               (long)tri_list[0]);
        ref_cavity_local._4_4_ = 1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0xc3
             ,"ref_cavity_remove_seg_add_tets",(ulong)ref_cavity_local._4_4_,"tri with2");
    }
  }
  else {
    ref_cavity_local._4_4_ = 0;
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_cavity_remove_seg_add_tets(REF_CAVITY ref_cavity,
                                                         REF_INT *seg_nodes) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT ntri, tri_list[2];
  REF_INT item, cell_node, cell;
  REF_BOOL already_have_it, all_local;
  REF_INT cell_face, face_node, face_nodes[3], tri_cell;

  if (!(ref_cavity->seg_rm_adds_tet) &&
      ref_list_n(ref_cavity_tet_list(ref_cavity)) == 0)
    return REF_SUCCESS;
  if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) return REF_SUCCESS;

  RSS(ref_cell_list_with2(ref_grid_tri(ref_grid), seg_nodes[0], seg_nodes[1], 2,
                          &ntri, tri_list),
      "tri with2");
  REIS(2, ntri, "cavity segment does not have two tri");

  each_ref_cell_having_node2(ref_cell, seg_nodes[0], seg_nodes[1], item,
                             cell_node, cell) {
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    if (already_have_it) continue;
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }
    each_ref_cell_cell_face(ref_cell, cell_face) {
      each_ref_cavity_face_node(ref_cavity, face_node) {
        face_nodes[face_node] =
            ref_cell_f2n(ref_cell, face_node, cell_face, cell);
      }
      RXS(ref_cell_with(ref_grid_tri(ref_grid), face_nodes, &tri_cell),
          REF_NOT_FOUND, "search for boundary tri");
      if (REF_EMPTY != tri_cell &&
          (tri_cell == tri_list[0] || tri_cell == tri_list[1])) {
        continue;
      }
      RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet face rm seg");
    }
  }
  return REF_SUCCESS;
}